

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_context.c
# Opt level: O0

EGLSurface glfwGetEGLSurface(GLFWwindow *handle)

{
  _GLFWwindow *window;
  GLFWwindow *handle_local;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    handle_local = (GLFWwindow *)0x0;
  }
  else if (*(int *)(handle + 0x204) == 0x36002) {
    handle_local = *(GLFWwindow **)(handle + 0x298);
  }
  else {
    _glfwInputError(0x1000a,(char *)0x0);
    handle_local = (GLFWwindow *)0x0;
  }
  return handle_local;
}

Assistant:

GLFWAPI EGLSurface glfwGetEGLSurface(GLFWwindow* handle)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    _GLFW_REQUIRE_INIT_OR_RETURN(EGL_NO_SURFACE);

    if (window->context.source != GLFW_EGL_CONTEXT_API)
    {
        _glfwInputError(GLFW_NO_WINDOW_CONTEXT, NULL);
        return EGL_NO_SURFACE;
    }

    return window->context.egl.surface;
}